

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_fixed_suite::fixed_expand_back_n(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  uint uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  allocator_type local_81;
  circular_view<int,_4UL> *local_80;
  ulong uStack_78;
  vector<int,_std::allocator<int>_> expect;
  int local_58 [4];
  int array [4];
  circular_view<int,_4UL> span;
  
  span.member.data = array;
  span.member.size = 0;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&expect;
  vista::circular_view<int,_4UL>::assign(&span,input);
  span.member.next = (ulong)((uint)span.member.next & 3) ^ 6;
  uVar1 = span.member.size - 3;
  span.member.size = span.member.size + 2;
  if (uVar1 < 2) {
    span.member.size = 4;
  }
  local_58[0] = 0x16;
  local_58[1] = 0x21;
  local_58[2] = 0;
  local_58[3] = 0xb;
  __l._M_len = 4;
  __l._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_81);
  first_begin.current._0_4_ = (uint)span.member.next - (int)span.member.size & 7;
  uVar2 = (uint)span.member.next & 7;
  uStack_78 = (ulong)uVar2;
  second_end._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current._0_4_ = uVar2;
  first_end.parent = &span;
  first_end.current._4_4_ = 0;
  first_begin.parent = &span;
  first_begin.current._4_4_ = 0;
  local_80 = &span;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x453,"void api_fixed_suite::fixed_expand_back_n()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void fixed_expand_back_n()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = { 11, 22, 33 };
    span.expand_back(2);
    {
        std::vector<int> expect = { 22, 33, 0, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}